

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O2

void advance_storagestate(DLword flg)

{
  uint datum;
  DLword *pDVar1;
  LispPTR LVar2;
  LispPTR LVar3;
  LispPTR LVar4;
  LispPTR LVar5;
  uint uVar6;
  undefined6 in_register_0000003a;
  
  *STORAGEFULLSTATE_word = (uint)CONCAT62(in_register_0000003a,flg) | 0xe0000;
  InterfacePage->fullspaceused = 0xffff;
  LVar2 = STORAGEFULLSTATE_index;
  datum = *SYSTEMCACHEVARS_word;
  while (uVar6 = 0, (*(ushort *)((long)MDStypetbl + (ulong)((datum >> 9) * 2) ^ 2) & 0x7ff) == 5) {
    LVar3 = car(datum);
    LVar4 = datum;
    if (LVar3 != LVar2) goto LAB_00129505;
    LVar4 = cdr(datum);
    uVar6 = 0;
    if (LVar4 == 0) break;
    LVar4 = cdr(datum);
    LVar4 = car(LVar4);
    rplaca(datum,LVar4);
    LVar4 = cdr(datum);
    LVar4 = cdr(LVar4);
    rplacd(datum,LVar4);
  }
LAB_0012955e:
  *SYSTEMCACHEVARS_word = uVar6;
  return;
LAB_00129505:
  while (LVar3 = LVar4, pDVar1 = MDStypetbl, LVar4 = cdr(LVar3), uVar6 = datum,
        (*(ushort *)((ulong)(pDVar1 + (LVar4 >> 9)) ^ 2) & 0x7ff) == 5) {
    LVar4 = cdr(LVar3);
    LVar5 = car(LVar4);
    LVar4 = cdr(LVar3);
    if (LVar5 == LVar2) {
      LVar4 = cdr(LVar4);
      rplacd(LVar3,LVar4);
      LVar4 = LVar3;
    }
  }
  goto LAB_0012955e;
}

Assistant:

static void advance_storagestate(DLword flg) {
#ifdef DEBUG
  printf("STORAGEFULLSTATE is now set to %d \n", flg);
#endif

  *STORAGEFULLSTATE_word = (S_POSITIVE | flg);
  InterfacePage->fullspaceused = 65535;
  *SYSTEMCACHEVARS_word = dremove(STORAGEFULLSTATE_index, *SYSTEMCACHEVARS_word);
}